

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::StatsAccumulator::AccumulatePixelStats(StatsAccumulator *this,PixelStatsAccumulator *accum)

{
  Point2i PVar1;
  Image *pIVar2;
  pointer pbVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  ulong uVar5;
  Allocator AVar6;
  int iVar7;
  PixelStats *pPVar8;
  long lVar9;
  int x_2;
  Stats *pSVar10;
  pointer pIVar11;
  Image *pIVar12;
  StatsAccumulator *pSVar13;
  int x_1;
  long lVar14;
  PixelStatsAccumulator *pPVar15;
  int x;
  long lVar16;
  Float FVar17;
  Float FVar18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  allocator<char> local_1d5;
  Float local_1d4;
  PixelStatsAccumulator *local_1d0;
  StatsAccumulator *local_1c8;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  long local_1b8;
  ulong local_1b0;
  string *local_1a8;
  ulong local_1a0;
  WrapMode2D local_198;
  WrapMode2D local_190;
  WrapMode2D local_188;
  WrapMode2D local_180;
  WrapMode2D local_178;
  WrapMode2D local_170;
  WrapMode2D local_168;
  ColorEncodingHandle local_160;
  WrapMode2D local_158;
  WrapMode2D local_150;
  ColorEncodingHandle local_148;
  WrapMode2D local_140;
  WrapMode2D local_138;
  Point2i vb;
  string local_110 [32];
  string local_f0 [32];
  ColorEncodingHandle local_d0;
  Point2i va;
  
  local_1d0 = accum;
  vb.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)Bounds2<int>::Diagonal((Bounds2<int> *)imageBounds);
  pSVar10 = this->stats;
  TVar4 = (pSVar10->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
  if (TVar4 == (Tuple2<pbrt::Point2,_int>)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"ms",&local_1d5);
    local_d0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    AVar6.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
    Image::Image((Image *)&va,Float,vb,channels,&local_d0,AVar6);
    Image::operator=(&this->stats->pixelTime,(Image *)&va);
    pPVar15 = local_1d0;
    Image::~Image((Image *)&va);
    std::__cxx11::string::~string((string *)&vb);
    pSVar10 = this->stats;
    TVar4 = (pSVar10->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
    iVar7 = TVar4.y;
  }
  else if ((TVar4.x != vb.super_Tuple2<pbrt::Point2,_int>.x) ||
          (iVar7 = TVar4.y, pPVar15 = local_1d0, iVar7 != vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    va.super_Tuple2<pbrt::Point2,_int> = TVar4;
    LogFatal<char_const(&)[30],char_const(&)[4],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[4],pbrt::Point2<int>&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
               ,0x105,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [30])"stats->pixelTime.Resolution()",(char (*) [4])0x3b41e7,
               (char (*) [30])"stats->pixelTime.Resolution()",&va,(char (*) [4])0x3b41e7,&vb);
  }
  vb.super_Tuple2<pbrt::Point2,_int> =
       (pPVar15->stats->time).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_1c8 = this;
  va.super_Tuple2<pbrt::Point2,_int> = TVar4;
  if ((TVar4.x == vb.super_Tuple2<pbrt::Point2,_int>.x) &&
     (iVar7 == vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    lVar14 = 0;
    lVar9 = 0;
    while (pPVar15 = local_1d0, lVar9 < (long)TVar4 >> 0x20) {
      local_1b8 = lVar9;
      for (lVar16 = 0; lVar16 < TVar4.x; lVar16 = lVar16 + 1) {
        WrapMode2D::WrapMode2D(&local_138,Clamp);
        PVar1.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar14 + lVar16);
        local_1d4 = Image::GetChannel(&pSVar10->pixelTime,PVar1,0,local_138);
        pPVar8 = local_1d0->stats;
        WrapMode2D::WrapMode2D(&local_140,Clamp);
        FVar17 = Image::GetChannel(&pPVar8->time,PVar1,0,local_140);
        Image::SetChannel(&pSVar10->pixelTime,PVar1,0,FVar17 + local_1d4);
        pSVar10 = local_1c8->stats;
        TVar4 = (pSVar10->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>;
      }
      lVar14 = lVar14 + 0x100000000;
      lVar9 = local_1b8 + 1;
    }
    pPVar8 = local_1d0->stats;
    uVar5 = (long)(pPVar8->counterImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pPVar8->counterImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pSVar13 = local_1c8;
    if ((ulong)((long)(pSVar10->pixelCounterImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pSVar10->pixelCounterImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar5) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (&pSVar10->pixelCounterImages,(long)uVar5 / 0x98);
      pSVar13 = local_1c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&local_1c8->stats->pixelCounterNames,
               (long)(pPVar15->stats->counterNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar15->stats->counterNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      pSVar10 = pSVar13->stats;
      pPVar8 = pPVar15->stats;
    }
    uVar5 = (long)(pPVar8->ratioImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pPVar8->ratioImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)((long)(pSVar10->pixelRatioImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pSVar10->pixelRatioImages).
                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                     super__Vector_impl_data._M_start) < uVar5) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (&pSVar10->pixelRatioImages,(long)uVar5 / 0x98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&pSVar13->stats->pixelRatioNames,
               (long)(pPVar15->stats->ratioNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pPVar15->stats->ratioNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    }
    uVar5 = 0;
    while( true ) {
      pPVar8 = pPVar15->stats;
      pIVar11 = (pPVar8->counterImages).
                super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pPVar8->counterImages).
                         super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pIVar11) / 0x98) <= uVar5) break;
      pbVar3 = (local_1c8->stats->pixelCounterNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[uVar5]._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)(pbVar3 + uVar5));
        pIVar11 = (pPVar15->stats->counterImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      TVar4 = pIVar11[uVar5].resolution.super_Tuple2<pbrt::Point2,_int>;
      local_1b0 = uVar5;
      if (TVar4 != (Tuple2<pbrt::Point2,_int>)0x0) {
        pIVar12 = pIVar11 + uVar5;
        pIVar11 = (local_1c8->stats->pixelCounterImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar2 = pIVar11 + uVar5;
        if (pIVar11[uVar5].resolution.super_Tuple2<pbrt::Point2,_int> ==
            (Tuple2<pbrt::Point2,_int>)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"count",&local_1d5);
          local_148.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          AVar6.memoryResource = pstd::pmr::new_delete_resource();
          channels_00.n = 1;
          channels_00.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
          ;
          Image::Image((Image *)&va,Float,(Point2i)TVar4,channels_00,&local_148,AVar6);
          Image::operator=(pIVar2,(Image *)&va);
          Image::~Image((Image *)&va);
          std::__cxx11::string::~string((string *)&vb);
          TVar4 = (pIVar12->resolution).super_Tuple2<pbrt::Point2,_int>;
        }
        lVar14 = 0;
        lVar9 = 0;
        while (lVar9 < (long)TVar4 >> 0x20) {
          local_1b8 = lVar9;
          for (lVar16 = 0; lVar16 < TVar4.x; lVar16 = lVar16 + 1) {
            WrapMode2D::WrapMode2D(&local_150,Clamp);
            PVar1.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar14 + lVar16);
            local_1d4 = Image::GetChannel(pIVar2,PVar1,0,local_150);
            WrapMode2D::WrapMode2D(&local_158,Clamp);
            FVar17 = Image::GetChannel(pIVar12,PVar1,0,local_158);
            Image::SetChannel(pIVar2,PVar1,0,FVar17 + local_1d4);
            TVar4 = (pIVar12->resolution).super_Tuple2<pbrt::Point2,_int>;
          }
          lVar14 = lVar14 + 0x100000000;
          lVar9 = local_1b8 + 1;
        }
      }
      uVar5 = local_1b0 + 1;
      pPVar15 = local_1d0;
    }
    local_1a8 = local_110;
    pSVar13 = local_1c8;
    for (uVar5 = 0;
        pIVar11 = (pPVar8->ratioImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar5 < (ulong)(((long)(pPVar8->ratioImages).
                               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)pIVar11) / 0x98);
        uVar5 = uVar5 + 1) {
      pbVar3 = (pSVar13->stats->pixelRatioNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[uVar5]._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)(pbVar3 + uVar5));
        pPVar8 = local_1d0->stats;
        pIVar11 = (pPVar8->ratioImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      TVar4 = pIVar11[uVar5].resolution.super_Tuple2<pbrt::Point2,_int>;
      if (TVar4 != (Tuple2<pbrt::Point2,_int>)0x0) {
        pIVar12 = pIVar11 + uVar5;
        pIVar11 = (pSVar13->stats->pixelRatioImages).
                  super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar2 = pIVar11 + uVar5;
        local_1a0 = uVar5;
        if (pIVar11[uVar5].resolution.super_Tuple2<pbrt::Point2,_int> ==
            (Tuple2<pbrt::Point2,_int>)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"numerator",&local_1d5);
          std::__cxx11::string::string<std::allocator<char>>(local_110,"denominator",&local_1b9);
          std::__cxx11::string::string<std::allocator<char>>(local_f0,"ratio",&local_1ba);
          local_160.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          AVar6.memoryResource = pstd::pmr::new_delete_resource();
          channels_01.n = 3;
          channels_01.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
          ;
          Image::Image((Image *)&va,Float,(Point2i)TVar4,channels_01,&local_160,AVar6);
          Image::operator=(pIVar2,(Image *)&va);
          Image::~Image((Image *)&va);
          lVar9 = 0x40;
          do {
            std::__cxx11::string::~string
                      ((string *)((long)&vb.super_Tuple2<pbrt::Point2,_int>.x + lVar9));
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != -0x20);
          TVar4 = (pIVar12->resolution).super_Tuple2<pbrt::Point2,_int>;
        }
        local_1b8 = 0;
        uVar5 = 0;
        while ((long)uVar5 < (long)TVar4 >> 0x20) {
          local_1b0 = uVar5;
          for (lVar9 = 0; lVar9 < TVar4.x; lVar9 = lVar9 + 1) {
            WrapMode2D::WrapMode2D(&local_168,Clamp);
            PVar1.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_1b8 + lVar9);
            local_1d4 = Image::GetChannel(pIVar2,PVar1,0,local_168);
            WrapMode2D::WrapMode2D(&local_170,Clamp);
            FVar17 = Image::GetChannel(pIVar12,PVar1,0,local_170);
            Image::SetChannel(pIVar2,PVar1,0,FVar17 + local_1d4);
            WrapMode2D::WrapMode2D(&local_178,Clamp);
            local_1d4 = Image::GetChannel(pIVar2,PVar1,1,local_178);
            WrapMode2D::WrapMode2D(&local_180,Clamp);
            FVar17 = Image::GetChannel(pIVar12,PVar1,1,local_180);
            Image::SetChannel(pIVar2,PVar1,1,FVar17 + local_1d4);
            WrapMode2D::WrapMode2D(&local_188,Clamp);
            FVar17 = Image::GetChannel(pIVar2,PVar1,0,local_188);
            FVar18 = 0.0;
            if ((FVar17 != 0.0) || (NAN(FVar17))) {
              WrapMode2D::WrapMode2D(&local_190,Clamp);
              local_1d4 = Image::GetChannel(pIVar2,PVar1,0,local_190);
              WrapMode2D::WrapMode2D(&local_198,Clamp);
              FVar18 = Image::GetChannel(pIVar2,PVar1,1,local_198);
              FVar18 = local_1d4 / FVar18;
            }
            Image::SetChannel(pIVar2,PVar1,2,FVar18);
            TVar4 = (pIVar12->resolution).super_Tuple2<pbrt::Point2,_int>;
          }
          local_1b8 = local_1b8 + 0x100000000;
          uVar5 = local_1b0 + 1;
        }
        pPVar8 = local_1d0->stats;
        pSVar13 = local_1c8;
        uVar5 = local_1a0;
      }
    }
    return;
  }
  LogFatal<char_const(&)[30],char_const(&)[31],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[31],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
             ,0x106,"Check failed: %s == %s with %s = %s, %s = %s",
             (char (*) [30])"stats->pixelTime.Resolution()",
             (char (*) [31])"accum.stats->time.Resolution()",
             (char (*) [30])"stats->pixelTime.Resolution()",&va,
             (char (*) [31])"accum.stats->time.Resolution()",&vb);
}

Assistant:

void StatsAccumulator::AccumulatePixelStats(const PixelStatsAccumulator &accum) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->pixelTime.Resolution() == Point2i(0, 0))
        stats->pixelTime = Image(PixelFormat::Float, res, {"ms"});
    else
        CHECK_EQ(stats->pixelTime.Resolution(), res);
    CHECK_EQ(stats->pixelTime.Resolution(), accum.stats->time.Resolution());

    for (int y = 0; y < stats->pixelTime.Resolution().y; ++y)
        for (int x = 0; x < stats->pixelTime.Resolution().x; ++x)
            stats->pixelTime.SetChannel({x, y}, 0,
                                        (stats->pixelTime.GetChannel({x, y}, 0) +
                                         accum.stats->time.GetChannel({x, y}, 0)));

    if (stats->pixelCounterImages.size() < accum.stats->counterImages.size()) {
        stats->pixelCounterImages.resize(accum.stats->counterImages.size());
        stats->pixelCounterNames.resize(accum.stats->counterNames.size());
    }
    if (stats->pixelRatioImages.size() < accum.stats->ratioImages.size()) {
        stats->pixelRatioImages.resize(accum.stats->ratioImages.size());
        stats->pixelRatioNames.resize(accum.stats->ratioNames.size());
    }

    for (size_t i = 0; i < accum.stats->counterImages.size(); ++i) {
        if (stats->pixelCounterNames[i].empty())
            stats->pixelCounterNames[i] = accum.stats->counterNames[i];

        const Image &threadImage = accum.stats->counterImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelCounterImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(), {"count"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x)
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
    }
    for (size_t i = 0; i < accum.stats->ratioImages.size(); ++i) {
        if (stats->pixelRatioNames[i].empty())
            stats->pixelRatioNames[i] = accum.stats->ratioNames[i];

        const Image &threadImage = accum.stats->ratioImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelRatioImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(),
                               {"numerator", "denominator", "ratio"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x) {
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
                accumImage.SetChannel({x, y}, 1,
                                      (accumImage.GetChannel({x, y}, 1) +
                                       threadImage.GetChannel({x, y}, 1)));
                if (accumImage.GetChannel({x, y}, 0) == 0)
                    accumImage.SetChannel({x, y}, 2, 0.f);
                else
                    accumImage.SetChannel({x, y}, 2,
                                          (accumImage.GetChannel({x, y}, 0) /
                                           accumImage.GetChannel({x, y}, 1)));
            }
    }
}